

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageUtil.cpp
# Opt level: O0

EGLImageKHR __thiscall
deqp::egl::Image::GLImageSource::createImage
          (GLImageSource *this,Library *egl,EGLDisplay dpy,EGLContext ctx,
          EGLClientBuffer clientBuffer)

{
  size_t sVar1;
  uint uVar2;
  int iVar3;
  deUint32 err;
  mapped_type *pmVar4;
  const_reference pvVar5;
  undefined4 extraout_var;
  EGLImageKHR image;
  vector<int,_std::allocator<int>_> attribs;
  key_type local_64;
  undefined1 local_60 [8];
  AttribMap attribMap;
  EGLClientBuffer clientBuffer_local;
  EGLContext ctx_local;
  EGLDisplay dpy_local;
  Library *egl_local;
  GLImageSource *this_local;
  
  attribMap._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)clientBuffer;
  (*(this->super_ImageSource)._vptr_ImageSource[6])();
  local_64 = 0x30d2;
  pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      local_60,&local_64);
  *pmVar4 = 1;
  eglu::attribMapToList((vector<int,_std::allocator<int>_> *)&image,(AttribMap *)local_60);
  uVar2 = (*(this->super_ImageSource)._vptr_ImageSource[7])();
  sVar1 = attribMap._M_t._M_impl.super__Rb_tree_header._M_node_count;
  pvVar5 = std::vector<int,_std::allocator<int>_>::front
                     ((vector<int,_std::allocator<int>_> *)&image);
  iVar3 = (*egl->_vptr_Library[8])(egl,dpy,ctx,(ulong)uVar2,sVar1,pvVar5);
  err = (*egl->_vptr_Library[0x1f])();
  eglu::checkError(err,"eglCreateImageKHR()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                   ,0xad);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&image);
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)local_60)
  ;
  return (EGLImageKHR)CONCAT44(extraout_var,iVar3);
}

Assistant:

EGLImageKHR GLImageSource::createImage (const Library& egl, EGLDisplay dpy, EGLContext ctx, EGLClientBuffer clientBuffer) const
{
	AttribMap				attribMap	= getCreateAttribs();

	attribMap[EGL_IMAGE_PRESERVED_KHR] = EGL_TRUE;

	{
		const vector<EGLint>	attribs	= eglu::attribMapToList(attribMap);
		const EGLImageKHR		image	= egl.createImageKHR(dpy, ctx, getSource(),
															 clientBuffer, &attribs.front());
		EGLU_CHECK_MSG(egl, "eglCreateImageKHR()");
		return image;
	}
}